

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O2

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *AutoPtr;
  Uint32 UVar1;
  int iVar2;
  iterator iVar3;
  BottomLevelASVkImpl *pObj;
  undefined4 in_register_0000000c;
  ulong uVar4;
  undefined4 in_register_00000084;
  InstanceDesc *Desc;
  ulong uVar5;
  Uint32 InstanceOffset;
  Uint32 local_8c;
  TLASBuildInstanceData *local_88;
  undefined8 local_80;
  uint local_74;
  TopLevelASBase<Diligent::EngineVkImplTraits> *local_70;
  ulong local_68;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  ulong local_58;
  string msg;
  undefined7 uVar6;
  
  local_80 = CONCAT44(in_register_00000084,HitGroupStride);
  local_8c = BaseContributionToHitGroupIndex;
  local_88 = pInstances;
  local_70 = this;
  if ((this->m_BuildInfo).InstanceCount != InstanceCount) {
    FormatString<char[26],char[49]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_BuildInfo.InstanceCount == InstanceCount",
               (char (*) [49])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateInstances",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xac);
    std::__cxx11::string::~string((string *)&msg);
  }
  InstanceOffset = local_8c;
  local_60 = &(local_70->m_Instances)._M_h;
  local_68 = (ulong)InstanceCount;
  uVar4 = 0;
  local_74 = (uint)BindingMode;
  local_58 = 0;
  do {
    if (local_68 == uVar4) {
      UVar1 = (Uint32)local_80;
      iVar2 = -1;
      if (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS) {
        iVar2 = UVar1 - 1;
      }
      if (((((local_58 & 1) != 0) || ((local_70->m_BuildInfo).HitGroupStride != UVar1)) ||
          ((local_70->m_BuildInfo).FirstContributionToHitGroupIndex != local_8c)) ||
         (((local_70->m_BuildInfo).LastContributionToHitGroupIndex != iVar2 + InstanceOffset ||
          ((local_70->m_BuildInfo).BindingMode != BindingMode)))) {
        LOCK();
        (local_70->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
             (local_70->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      (local_70->m_BuildInfo).HitGroupStride = UVar1;
      (local_70->m_BuildInfo).FirstContributionToHitGroupIndex = local_8c;
      (local_70->m_BuildInfo).LastContributionToHitGroupIndex = iVar2 + InstanceOffset;
      (local_70->m_BuildInfo).BindingMode = BindingMode;
LAB_001ce74b:
      return local_68 <= uVar4;
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,local_88->InstanceName,false);
    iVar3 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_60,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
        ._M_cur == (__node_type *)0x0) {
      FormatString<char[36],char_const*,char[39]>
                (&msg,(Diligent *)"Failed to find instance with name \'",(char (*) [36])local_88,
                 (char **)"\' in instances from the previous build",
                 (char (*) [39])CONCAT44(in_register_00000084,HitGroupStride));
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateInstances",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0xb9);
      std::__cxx11::string::~string((string *)&msg);
      goto LAB_001ce74b;
    }
    UVar1 = *(Uint32 *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                    ._M_cur + 0x18);
    AutoPtr = (RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                     ._M_cur + 0x20);
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&msg,AutoPtr);
    pObj = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(local_88->pBLAS);
    Desc = (InstanceDesc *)
           ((long)iVar3.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                  ._M_cur + 0x18);
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=(AutoPtr,pObj);
    Desc->ContributionToHitGroupIndex = local_88->ContributionToHitGroupIndex;
    CalculateHitGroupIndex(Desc,&InstanceOffset,(Uint32)local_80,(HIT_GROUP_BINDING_MODE)local_74);
    uVar6 = (undefined7)((ulong)AutoPtr >> 8);
    uVar5 = CONCAT71(uVar6,1);
    if (((local_58 & 1) == 0) && ((BottomLevelASVkImpl *)msg._M_dataplus._M_p == AutoPtr->m_pObject)
       ) {
      uVar5 = CONCAT71(uVar6,UVar1 != Desc->ContributionToHitGroupIndex);
    }
    *(__int_type_conflict1 *)
     ((long)iVar3.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
            ._M_cur + 0x28) =
         (AutoPtr->m_pObject->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_DvpVersion.
         super___atomic_base<unsigned_int>._M_i;
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&msg);
    uVar4 = uVar4 + 1;
    local_88 = local_88 + 1;
    local_58 = uVar5 & 0xffffffff;
  } while( true );
}

Assistant:

bool UpdateInstances(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        VERIFY_EXPR(this->m_BuildInfo.InstanceCount == InstanceCount);
#ifdef DILIGENT_DEVELOPMENT
        bool Changed = false;
#endif
        Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

        for (Uint32 i = 0; i < InstanceCount; ++i)
        {
            const auto& Inst = pInstances[i];
            auto        Iter = this->m_Instances.find(Inst.InstanceName);

            if (Iter == this->m_Instances.end())
            {
                UNEXPECTED("Failed to find instance with name '", Inst.InstanceName, "' in instances from the previous build");
                return false;
            }

            auto&      Desc      = Iter->second;
            const auto PrevIndex = Desc.ContributionToHitGroupIndex;
            const auto pPrevBLAS = Desc.pBLAS;

            Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
            Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            //Desc.InstanceIndex             = i; // keep Desc.InstanceIndex unmodified
            CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
            Changed         = Changed || (pPrevBLAS != Desc.pBLAS);
            Changed         = Changed || (PrevIndex != Desc.ContributionToHitGroupIndex);
            Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
        }

        InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

#ifdef DILIGENT_DEVELOPMENT
        Changed = Changed || (this->m_BuildInfo.HitGroupStride != HitGroupStride);
        Changed = Changed || (this->m_BuildInfo.FirstContributionToHitGroupIndex != BaseContributionToHitGroupIndex);
        Changed = Changed || (this->m_BuildInfo.LastContributionToHitGroupIndex != InstanceOffset);
        Changed = Changed || (this->m_BuildInfo.BindingMode != BindingMode);
        if (Changed)
            this->m_DvpVersion.fetch_add(1);
#endif
        this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
        this->m_BuildInfo.BindingMode                      = BindingMode;

        return true;
    }